

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O3

int query(void *userData,char *query,size_t queryLen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int iVar4;
  uint uVar5;
  IContext *pIVar6;
  undefined4 extraout_var;
  ExpressionResultBuilder *pEVar7;
  undefined4 extraout_var_00;
  undefined8 uVar8;
  AssertionInfo __assertionInfo178;
  long *local_338;
  long local_330;
  long local_328 [2];
  string local_318;
  string local_2f8;
  size_t local_2d8;
  char *local_2d0;
  AssertionInfo local_2c8;
  ExpressionResultBuilder local_258;
  
  local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
  local_2d8 = queryLen;
  local_2d0 = query;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"CAPTURE","");
  local_338 = local_328;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_338,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
             ,"");
  paVar2 = &local_258.m_data.reconstructedExpression.field_2;
  local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_258,local_338,local_330 + (long)local_338);
  local_258.m_data.message._M_dataplus._M_p = (pointer)0xb2;
  paVar1 = &local_2f8.field_2;
  local_2f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
  Catch::AssertionInfo::AssertionInfo
            (&local_2c8,&local_318,(SourceLineInfo *)&local_258,&local_2f8,ContinueOnFailure);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar2) {
    operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                    local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if (local_338 != local_328) {
    operator_delete(local_338,local_328[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  pIVar6 = Catch::getCurrentContext();
  iVar4 = (*pIVar6->_vptr_IContext[2])(pIVar6);
  Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_258.m_stream,"query := ",9);
  pEVar7 = Catch::ExpressionResultBuilder::operator<<(&local_258,&local_2d0);
  uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x40))
                    ((long *)CONCAT44(extraout_var,iVar4),pEVar7,&local_2c8);
  Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
  if ((uVar5 & 4) == 0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.capturedExpression._M_dataplus._M_p != &local_2c8.capturedExpression.field_2) {
      operator_delete(local_2c8.capturedExpression._M_dataplus._M_p,
                      local_2c8.capturedExpression.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.lineInfo.file._M_dataplus._M_p != &local_2c8.lineInfo.file.field_2) {
      operator_delete(local_2c8.lineInfo.file._M_dataplus._M_p,
                      local_2c8.lineInfo.file.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_2c8.macroName.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c8.macroName._M_dataplus._M_p != paVar3) {
      operator_delete(local_2c8.macroName._M_dataplus._M_p,
                      local_2c8.macroName.field_2._M_allocated_capacity + 1);
    }
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"CAPTURE","");
    local_338 = local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_338,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,"");
    local_258.m_data.reconstructedExpression._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,local_338,local_330 + (long)local_338);
    local_258.m_data.message._M_dataplus._M_p = (pointer)0xb3;
    local_2f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"");
    Catch::AssertionInfo::AssertionInfo
              (&local_2c8,&local_318,(SourceLineInfo *)&local_258,&local_2f8,ContinueOnFailure);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258.m_data.reconstructedExpression._M_dataplus._M_p != paVar2) {
      operator_delete(local_258.m_data.reconstructedExpression._M_dataplus._M_p,
                      local_258.m_data.reconstructedExpression.field_2._M_allocated_capacity + 1);
    }
    if (local_338 != local_328) {
      operator_delete(local_338,local_328[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    pIVar6 = Catch::getCurrentContext();
    iVar4 = (*pIVar6->_vptr_IContext[2])(pIVar6);
    Catch::ExpressionResultBuilder::ExpressionResultBuilder(&local_258,Info);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_258.m_stream,"queryLen := ",0xc);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_258.m_stream);
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar4) + 0x40))
                      ((long *)CONCAT44(extraout_var_00,iVar4),&local_258,&local_2c8);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder(&local_258);
    if ((uVar5 & 4) == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8.capturedExpression._M_dataplus._M_p != &local_2c8.capturedExpression.field_2)
      {
        operator_delete(local_2c8.capturedExpression._M_dataplus._M_p,
                        local_2c8.capturedExpression.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8.lineInfo.file._M_dataplus._M_p != &local_2c8.lineInfo.file.field_2) {
        operator_delete(local_2c8.lineInfo.file._M_dataplus._M_p,
                        local_2c8.lineInfo.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8.macroName._M_dataplus._M_p != paVar3) {
        operator_delete(local_2c8.macroName._M_dataplus._M_p,
                        local_2c8.macroName.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((long)userData + 0xd0,0,*(char **)((long)userData + 0xd8),(ulong)local_2d0);
      return 1;
    }
    uVar8 = __cxa_allocate_exception(1);
    __cxa_throw(uVar8,&Catch::TestFailureException::typeinfo,0);
  }
  uVar8 = __cxa_allocate_exception(1);
  __cxa_throw(uVar8,&Catch::TestFailureException::typeinfo,0);
}

Assistant:

inline int query(void* userData, const char* query, size_t queryLen)
{
    CAPTURE(query);
    CAPTURE(queryLen);
    static_cast<URI*>(userData)->query.assign(query,queryLen);
    return 1;
}